

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *function,
          idx_t depth,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr)

{
  string *catalog;
  string *schema;
  string *name_p;
  QueryErrorContext error_context_p;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> _Var2;
  BindResult *__return_storage_ptr___00;
  bool bVar3;
  int iVar4;
  optional_ptr<duckdb::CatalogEntry,_true> oVar5;
  type pCVar6;
  CatalogEntry *pCVar7;
  pointer pOVar8;
  InvalidInputException *this_00;
  BinderException *this_01;
  CatalogType type;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_190;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_188;
  optional_ptr<duckdb::CatalogEntry,_true> func;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_168;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_160;
  BindResult *local_158;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  ErrorData error;
  EntryLookupInfo table_function_lookup;
  EntryLookupInfo function_lookup;
  
  error_context_p.query_location.index =
       (optional_idx)(function->super_ParsedExpression).super_BaseExpression.query_location.index;
  catalog = &function->catalog;
  schema = &function->schema;
  local_160 = expr_ptr;
  local_158 = __return_storage_ptr__;
  Binder::BindSchemaOrCatalog(this->binder,catalog,schema);
  name_p = &function->function_name;
  EntryLookupInfo::EntryLookupInfo(&function_lookup,SCALAR_FUNCTION_ENTRY,name_p,error_context_p);
  func = GetCatalogEntry(this,catalog,schema,&function_lookup,RETURN_NULL);
  if (func.ptr == (CatalogEntry *)0x0) {
    EntryLookupInfo::EntryLookupInfo
              (&table_function_lookup,TABLE_FUNCTION_ENTRY,name_p,error_context_p);
    oVar5 = GetCatalogEntry(this,catalog,schema,&table_function_lookup,RETURN_NULL);
    if (oVar5.ptr != (CatalogEntry *)0x0) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&error,
                 "Function \"%s\" is a table function but it was used as a scalar function. This function has to be called in a FROM clause (similar to a table)."
                 ,(allocator *)&local_190);
      ::std::__cxx11::string::string((string *)&local_110,(string *)name_p);
      BinderException::BinderException<std::__cxx11::string>
                (this_01,&function->super_ParsedExpression,(string *)&error,&local_110);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((function->schema)._M_string_length != 0) {
      ErrorData::ErrorData(&error);
      local_190._M_head_impl = (ColumnRefExpression *)0x0;
      if ((function->catalog)._M_string_length == 0) {
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&local_188,schema);
      }
      else {
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&,std::__cxx11::string&>
                  ((duckdb *)&local_188,schema,catalog);
      }
      _Var2._M_head_impl = local_188._M_head_impl;
      _Var1._M_head_impl = local_190._M_head_impl;
      local_188._M_head_impl = (ColumnRefExpression *)0x0;
      local_190._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (ColumnRefExpression *)0x0) {
        (*((_Var1._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
          [1])();
        if (local_188._M_head_impl != (ColumnRefExpression *)0x0) {
          (*((local_188._M_head_impl)->super_ParsedExpression).super_BaseExpression.
            _vptr_BaseExpression[1])();
        }
      }
      pCVar6 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
               ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                            *)&local_190);
      (*this->_vptr_ExpressionBinder[2])(&local_188,this,pCVar6,&error);
      pCVar6 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
               ::operator*((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                            *)&local_190);
      iVar4 = (*this->_vptr_ExpressionBinder[4])(this,pCVar6);
      _Var1._M_head_impl = local_190._M_head_impl;
      if ((byte)((byte)iVar4 | error.initialized ^ 1U) == 1) {
        local_190._M_head_impl = (ColumnRefExpression *)0x0;
        local_168._M_head_impl = _Var1._M_head_impl;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::_M_insert_rval(&(function->children).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ,(function->children).
                          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_168);
        if (local_168._M_head_impl != (ColumnRefExpression *)0x0) {
          (*((local_168._M_head_impl)->super_ParsedExpression).super_BaseExpression.
            _vptr_BaseExpression[1])();
        }
        ::std::__cxx11::string::assign((char *)catalog);
        ::std::__cxx11::string::assign((char *)schema);
      }
      if (local_188._M_head_impl != (ColumnRefExpression *)0x0) {
        (*((local_188._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      if (local_190._M_head_impl != (ColumnRefExpression *)0x0) {
        (*((local_190._M_head_impl)->super_ParsedExpression).super_BaseExpression.
          _vptr_BaseExpression[1])();
      }
      ErrorData::~ErrorData(&error);
    }
    func = GetCatalogEntry(this,catalog,schema,&function_lookup,THROW_EXCEPTION);
  }
  pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
  if (pCVar7->type != AGGREGATE_FUNCTION_ENTRY) {
    if ((function->distinct == false) &&
       ((function->filter).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
        (ParsedExpression *)0x0)) {
      pOVar8 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
               operator->(&function->order_bys);
      if ((pOVar8->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pOVar8->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
          super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_015edaaf;
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&error,
               "Function \"%s\" is a %s. \"DISTINCT\", \"FILTER\", and \"ORDER BY\" are only applicable to aggregate functions."
               ,(allocator *)&table_function_lookup);
    ::std::__cxx11::string::string((string *)&local_130,(string *)name_p);
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
    CatalogTypeToString_abi_cxx11_(&local_150,(duckdb *)(ulong)pCVar7->type,type);
    InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
              (this_00,(string *)&error,&local_130,&local_150);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_015edaaf:
  pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
  __return_storage_ptr___00 = local_158;
  if (pCVar7->type == MACRO_ENTRY) {
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
    (*this->_vptr_ExpressionBinder[0xc])
              (__return_storage_ptr___00,this,function,pCVar7,depth,local_160);
  }
  else if (pCVar7->type == SCALAR_FUNCTION_ENTRY) {
    bVar3 = FunctionExpression::IsLambdaFunction(function);
    if (bVar3) {
      pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&func);
      TryBindLambdaOrJson(__return_storage_ptr___00,this,function,depth,pCVar7);
    }
    else {
      pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
      (*this->_vptr_ExpressionBinder[8])(__return_storage_ptr___00,this,function,pCVar7,depth);
    }
  }
  else {
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&func);
    (*this->_vptr_ExpressionBinder[10])(__return_storage_ptr___00,this,function,pCVar7,depth);
  }
  return __return_storage_ptr___00;
}

Assistant:

BindResult ExpressionBinder::BindExpression(FunctionExpression &function, idx_t depth,
                                            unique_ptr<ParsedExpression> &expr_ptr) {
	// lookup the function in the catalog
	QueryErrorContext error_context(function.GetQueryLocation());
	binder.BindSchemaOrCatalog(function.catalog, function.schema);

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, function.function_name, error_context);
	auto func = GetCatalogEntry(function.catalog, function.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (!func) {
		// function was not found - check if we this is a table function
		EntryLookupInfo table_function_lookup(CatalogType::TABLE_FUNCTION_ENTRY, function.function_name, error_context);
		auto table_func =
		    GetCatalogEntry(function.catalog, function.schema, table_function_lookup, OnEntryNotFound::RETURN_NULL);
		if (table_func) {
			throw BinderException(function,
			                      "Function \"%s\" is a table function but it was used as a scalar function. This "
			                      "function has to be called in a FROM clause (similar to a table).",
			                      function.function_name);
		}
		// not a table function - check if the schema is set
		if (!function.schema.empty()) {
			// the schema is set - check if we can turn this the schema into a column ref
			ErrorData error;
			unique_ptr<ColumnRefExpression> colref;
			if (function.catalog.empty()) {
				colref = make_uniq<ColumnRefExpression>(function.schema);
			} else {
				colref = make_uniq<ColumnRefExpression>(function.schema, function.catalog);
			}
			auto new_colref = QualifyColumnName(*colref, error);
			bool is_col = !error.HasError();
			bool is_col_alias = QualifyColumnAlias(*colref);

			if (is_col || is_col_alias) {
				// we can! transform this into a function call on the column
				// i.e. "x.lower()" becomes "lower(x)"
				function.children.insert(function.children.begin(), std::move(colref));
				function.catalog = INVALID_CATALOG;
				function.schema = INVALID_SCHEMA;
			}
		}
		// rebind the function
		func = GetCatalogEntry(function.catalog, function.schema, function_lookup, OnEntryNotFound::THROW_EXCEPTION);
	}

	if (func->type != CatalogType::AGGREGATE_FUNCTION_ENTRY &&
	    (function.distinct || function.filter || !function.order_bys->orders.empty())) {
		throw InvalidInputException("Function \"%s\" is a %s. \"DISTINCT\", \"FILTER\", and \"ORDER BY\" are only "
		                            "applicable to aggregate functions.",
		                            function.function_name, CatalogTypeToString(func->type));
	}

	switch (func->type) {
	case CatalogType::SCALAR_FUNCTION_ENTRY: {
		if (function.IsLambdaFunction()) {
			return TryBindLambdaOrJson(function, depth, *func);
		}
		return BindFunction(function, func->Cast<ScalarFunctionCatalogEntry>(), depth);
	}
	case CatalogType::MACRO_ENTRY:
		// macro function
		return BindMacro(function, func->Cast<ScalarMacroCatalogEntry>(), depth, expr_ptr);
	default:
		// aggregate function
		return BindAggregate(function, func->Cast<AggregateFunctionCatalogEntry>(), depth);
	}
}